

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O1

void redraw_frame(void)

{
  WINDOW *pWVar1;
  int iVar2;
  int iVar3;
  gamewin *pgVar4;
  
  if ((ui_flags.draw_frame != '\0') && (ui_flags.ingame != '\0')) {
    draw_frame();
    wnoutrefresh(basewin);
    iVar3 = -1;
    iVar2 = -1;
    if (mapwin != (WINDOW *)0x0) {
      iVar2 = mapwin->_maxy + 1;
    }
    wtouchln(mapwin,0,iVar2,1);
    if (msgwin != (WINDOW *)0x0) {
      iVar3 = msgwin->_maxy + 1;
    }
    wtouchln(msgwin,0,iVar3,1);
    wnoutrefresh(mapwin);
    wnoutrefresh(msgwin);
    if (statuswin != (WINDOW *)0x0) {
      wtouchln(statuswin,0,statuswin->_maxy + 1,1);
      wnoutrefresh(statuswin);
    }
    pgVar4 = firstgw;
    if (sidebar != (WINDOW *)0x0) {
      draw_sidebar_divider();
      if (sidebar == (WINDOW *)0x0) {
        iVar2 = -1;
      }
      else {
        iVar2 = sidebar->_maxy + 1;
      }
      wtouchln(sidebar,0,iVar2,1);
      wnoutrefresh(sidebar);
      pgVar4 = firstgw;
    }
    for (; pgVar4 != (gamewin *)0x0; pgVar4 = pgVar4->next) {
      pWVar1 = pgVar4->win;
      if (pWVar1 == (WINDOW *)0x0) {
        iVar2 = -1;
      }
      else {
        iVar2 = pWVar1->_maxy + 1;
      }
      wtouchln(pWVar1,0,iVar2,1);
      wnoutrefresh(pgVar4->win);
    }
  }
  return;
}

Assistant:

void redraw_frame(void)
{
    struct gamewin *gw;

    if (!ui_flags.draw_frame || !ui_flags.ingame)
	return;

    draw_frame();
    wnoutrefresh(basewin);

    /* The order of the following is based on redraw_game_windows(). */
    touchwin(mapwin);
    touchwin(msgwin);
    wnoutrefresh(mapwin);
    wnoutrefresh(msgwin);
    if (statuswin) {
	touchwin(statuswin);
	wnoutrefresh(statuswin);
    }
    if (sidebar) {
	draw_sidebar_divider();
	touchwin(sidebar);
	wnoutrefresh(sidebar);
    }

    for (gw = firstgw; gw; gw = gw->next) {
	touchwin(gw->win);
	wnoutrefresh(gw->win);
    }
}